

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASCFile.cpp
# Opt level: O3

void __thiscall
ASCFile::parse_format
          (ASCFile *this,char **p,char **s,char **arena,char **arena_end,line_iterator_t *line_it)

{
  pointer *ppBVar1;
  iterator __position;
  double dVar2;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  BRDPoint local_30;
  undefined1 local_28 [16];
  
  if (this->m_firstformat == true) {
    line_it->_M_current = line_it->_M_current + 7;
    this->m_firstformat = false;
  }
  else {
    dVar2 = strtod(*p,p);
    local_28._8_4_ = extraout_XMM0_Dc;
    local_28._0_8_ = dVar2;
    local_28._12_4_ = extraout_XMM0_Dd;
    dVar2 = strtod(*p,p);
    local_30.y = (int)(dVar2 * 1000.0);
    local_30.x = (int)((double)local_28._0_8_ * 1000.0);
    __position._M_current =
         (this->super_BRDFileBase).format.super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->super_BRDFileBase).format.super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<BRDPoint,std::allocator<BRDPoint>>::_M_realloc_insert<BRDPoint_const&>
                ((vector<BRDPoint,std::allocator<BRDPoint>> *)&(this->super_BRDFileBase).format,
                 __position,&local_30);
    }
    else {
      *__position._M_current = local_30;
      ppBVar1 = &(this->super_BRDFileBase).format.
                 super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppBVar1 = *ppBVar1 + 1;
    }
  }
  return;
}

Assistant:

void ASCFile::parse_format(char *&p, char *&s, char *&arena, char *&arena_end, line_iterator_t &line_it) {
	if (m_firstformat) {
		line_it += 7; // Skip 7+1 unused lines before 1st point. Might not work with all files.
		m_firstformat = false;
		return; // lines++ in while loop
	}
	BRDPoint point;

	double x = READ_DOUBLE();
	point.x  = x * 1000.0f; // OBV uses integers
	double y = READ_DOUBLE();
	point.y  = y * 1000.0f;
	format.push_back(point);
}